

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void small_stats(small_alloc *alloc,small_stats *totals,_func_int_void_ptr_void_ptr *cb,void *cb_ctx
                )

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 local_60 [8];
  mempool_stats stats;
  
  totals->used = 0;
  totals->total = 0;
  uVar3 = 0;
  stats.totals.total = (size_t)cb_ctx;
  do {
    if (alloc->small_mempool_cache_size <= uVar3) {
      return;
    }
    uVar2 = (ulong)uVar3;
    uVar3 = uVar3 + (uVar3 < alloc->small_mempool_cache_size);
    mempool_stats(&alloc->small_mempool_cache[uVar2].pool,(mempool_stats *)local_60);
    totals->used = totals->used + stats._8_8_;
    totals->total = totals->total + stats.totals.used;
    iVar1 = (*cb)((mempool_stats *)local_60,(void *)stats.totals.total);
  } while (iVar1 == 0);
  return;
}

Assistant:

void
small_stats(struct small_alloc *alloc,
	    struct small_stats *totals,
	    int (*cb)(const void *, void *), void *cb_ctx)
{
	memset(totals, 0, sizeof(*totals));

	struct mempool_iterator it;
	mempool_iterator_create(&it, alloc);
	struct mempool *pool;

	while ((pool = mempool_iterator_next(&it))) {
		struct mempool_stats stats;
		mempool_stats(pool, &stats);
		totals->used += stats.totals.used;
		totals->total += stats.totals.total;
		if (cb(&stats, cb_ctx))
			break;
	}
}